

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O2

void __thiscall
vkt::memory::anon_unknown_0::BufferCopyToImage::~BufferCopyToImage(BufferCopyToImage *this)

{
  (this->super_CmdCommand)._vptr_CmdCommand = (_func_int **)&PTR__BufferCopyToImage_00bd45b8;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase
            (&(this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase
            (&(this->m_dstImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  return;
}

Assistant:

~BufferCopyToImage	(void) {}